

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * CheckEnvironmentType_abi_cxx11_(string *__return_storage_ptr__,int numOptions,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char *__s;
  
  if (0 < numOptions) {
    uVar4 = 1;
    do {
      pcVar3 = argv[uVar4];
      iVar1 = strncmp("--env=",pcVar3,6);
      if (iVar1 == 0) {
        __s = pcVar3 + 6;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar2 = strlen(__s);
        pcVar3 = pcVar3 + sVar2 + 6;
        goto LAB_00105d40;
      }
      uVar4 = uVar4 + 1;
    } while (numOptions + 1 != uVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __s = "xytheta";
  pcVar3 = "";
LAB_00105d40:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string CheckEnvironmentType(int numOptions, char** argv)
{
    int optionLength = strlen("--env=");
    for (int i = 1; i < numOptions + 1; i++) {
        if (strncmp("--env=", argv[i], optionLength) == 0) {
            std::string s(&argv[i][optionLength]);
            return s;
        }
    }
    return std::string("xytheta");
}